

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grand.c
# Opt level: O0

void g_rand_set_seed_array(GRand *rand,guint32 *seed,guint seed_length)

{
  guint local_2c;
  guint local_28;
  uint local_24;
  guint k;
  guint j;
  guint i;
  guint seed_length_local;
  guint32 *seed_local;
  GRand *rand_local;
  
  g_rand_set_seed(rand,0x12bd6aa);
  k = 1;
  local_24 = 0;
  local_2c = seed_length;
  if (seed_length < 0x270) {
    local_2c = 0x270;
  }
  for (local_28 = local_2c; local_28 != 0; local_28 = local_28 - 1) {
    rand->mt[k] = (rand->mt[k] ^ (rand->mt[k - 1] ^ rand->mt[k - 1] >> 0x1e) * 0x19660d) +
                  seed[local_24] + local_24;
    rand->mt[k] = rand->mt[k];
    k = k + 1;
    local_24 = local_24 + 1;
    if (0x26f < k) {
      rand->mt[0] = rand->mt[0x26f];
      k = 1;
    }
    if (seed_length <= local_24) {
      local_24 = 0;
    }
  }
  for (local_28 = 0x26f; local_28 != 0; local_28 = local_28 + -1) {
    rand->mt[k] = (rand->mt[k] ^ (rand->mt[k - 1] ^ rand->mt[k - 1] >> 0x1e) * 0x5d588b65) - k;
    rand->mt[k] = rand->mt[k];
    k = k + 1;
    if (0x26f < k) {
      rand->mt[0] = rand->mt[0x26f];
      k = 1;
    }
  }
  rand->mt[0] = 0x80000000;
  return;
}

Assistant:

void g_rand_set_seed_array (GRand *rand, const guint32 *seed, guint seed_length)
{
    guint i, j, k;

    g_return_if_fail (rand != NULL);
    g_return_if_fail (seed_length >= 1);

    g_rand_set_seed (rand, 19650218UL);

    i=1; j=0;
    k = (N>seed_length ? N : seed_length);
    for (; k; k--)
    {
        rand->mt[i] = (rand->mt[i] ^
                ((rand->mt[i-1] ^ (rand->mt[i-1] >> 30)) * 1664525UL))
            + seed[j] + j; /* non linear */
        rand->mt[i] &= 0xffffffffUL; /* for WORDSIZE > 32 machines */
        i++; j++;
        if (i>=N)
        {
            rand->mt[0] = rand->mt[N-1];
            i=1;
        }
        if (j>=seed_length)
            j=0;
    }
    for (k=N-1; k; k--)
    {
        rand->mt[i] = (rand->mt[i] ^
                ((rand->mt[i-1] ^ (rand->mt[i-1] >> 30)) * 1566083941UL))
            - i; /* non linear */
        rand->mt[i] &= 0xffffffffUL; /* for WORDSIZE > 32 machines */
        i++;
        if (i>=N)
        {
            rand->mt[0] = rand->mt[N-1];
            i=1;
        }
    }

    rand->mt[0] = 0x80000000UL; /* MSB is 1; assuring non-zero initial array */ 
}